

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_help.cpp
# Opt level: O2

void __thiscall
ktx::OptionsHelp::process(OptionsHelp *this,Options *param_1,ParseResult *args,Reporter *report)

{
  int iVar1;
  size_t sVar2;
  OptionValue *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_type sVar4;
  long lVar5;
  allocator<char> local_172;
  undefined1 local_171;
  undefined1 local_170;
  undefined1 local_16f;
  allocator<char> local_16e;
  allocator<char> local_16d;
  allocator<char> local_16c;
  allocator<char> local_16b;
  allocator<char> local_16a;
  allocator<char> local_169;
  string local_168;
  string local_148;
  string local_128;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"command",(allocator<char> *)&local_168);
  sVar2 = cxxopts::ParseResult::count(args,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  if (sVar2 != 0) {
    if (process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::command_table_abi_cxx11_ ==
        '\0') {
      iVar1 = __cxa_guard_acquire(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                                   command_table_abi_cxx11_);
      if (iVar1 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,"create",(allocator<char> *)&local_168);
        std::__cxx11::string::string<std::allocator<char>>(local_108,"extract",&local_172);
        std::__cxx11::string::string<std::allocator<char>>(local_e8,"encode",&local_169);
        std::__cxx11::string::string<std::allocator<char>>(local_c8,"transcode",&local_16a);
        std::__cxx11::string::string<std::allocator<char>>(local_a8,"info",&local_16b);
        std::__cxx11::string::string<std::allocator<char>>(local_88,"validate",&local_16c);
        std::__cxx11::string::string<std::allocator<char>>(local_68,"compare",&local_16d);
        std::__cxx11::string::string<std::allocator<char>>(local_48,"help",&local_16e);
        std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::_Hashtable<std::__cxx11::string_const*>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                       command_table_abi_cxx11_,&local_128,&stack0xffffffffffffffd8,0,&local_16f,
                   &local_170,&local_171);
        lVar5 = 0xe0;
        do {
          std::__cxx11::string::~string((string *)((long)&local_128._M_dataplus._M_p + lVar5));
          lVar5 = lVar5 + -0x20;
        } while (lVar5 != -0x20);
        __cxa_atexit(std::
                     unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::~unordered_set,
                     &process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                      command_table_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                             command_table_abi_cxx11_);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"command",&local_172);
    this_00 = cxxopts::ParseResult::operator[](args,&local_168);
    pbVar3 = cxxopts::OptionValue::as<std::__cxx11::string>(this_00);
    std::__cxx11::string::string((string *)&local_148,(string *)pbVar3);
    to_lower_copy(&local_128,&local_148);
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)this,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    sVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                     command_table_abi_cxx11_._M_h,(key_type *)this);
    if (sVar4 == 0) {
      Reporter::fatal_usage<char_const(&)[33],std::__cxx11::string&>
                (report,(char (*) [33])"Invalid command specified: \"{}\".",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    }
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        if (args.count("command")) {
            static const std::unordered_set<std::string> command_table{
                "create",
                "extract",
                "encode",
                "transcode",
                "info",
                "validate",
                "compare",
                "help",
            };

            command = to_lower_copy(args["command"].as<std::string>());
            if (command_table.count(*command) == 0)
                report.fatal_usage("Invalid command specified: \"{}\".", *command);
        }
    }